

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_calc_pframe_target_size_one_pass_vbr(AV1_COMP *cpi,FRAME_UPDATE_TYPE frame_update_type)

{
  AV1_PRIMARY *pAVar1;
  int iVar2;
  FRAME_UPDATE_TYPE in_SIL;
  AV1_COMP *in_RDI;
  int64_t target;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  int64_t local_28;
  
  pAVar1 = in_RDI->ppi;
  if (((in_SIL == '\0') || (in_SIL == '\x02')) || (in_SIL == '\x03')) {
    local_28 = ((long)(in_RDI->rc).avg_frame_bandwidth * (long)(pAVar1->p_rc).baseline_gf_interval *
               10) / (long)((pAVar1->p_rc).baseline_gf_interval + 9);
  }
  else {
    local_28 = ((long)(in_RDI->rc).avg_frame_bandwidth * (long)(pAVar1->p_rc).baseline_gf_interval)
               / (long)((pAVar1->p_rc).baseline_gf_interval + 9);
  }
  iVar2 = clamp_pframe_target_size(in_RDI,local_28,in_SIL);
  return iVar2;
}

Assistant:

int av1_calc_pframe_target_size_one_pass_vbr(
    const AV1_COMP *const cpi, FRAME_UPDATE_TYPE frame_update_type) {
  static const int af_ratio = 10;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int64_t target;
#if USE_ALTREF_FOR_ONE_PASS
  if (frame_update_type == KF_UPDATE || frame_update_type == GF_UPDATE ||
      frame_update_type == ARF_UPDATE) {
    target = ((int64_t)rc->avg_frame_bandwidth * p_rc->baseline_gf_interval *
              af_ratio) /
             (p_rc->baseline_gf_interval + af_ratio - 1);
  } else {
    target = ((int64_t)rc->avg_frame_bandwidth * p_rc->baseline_gf_interval) /
             (p_rc->baseline_gf_interval + af_ratio - 1);
  }
#else
  target = rc->avg_frame_bandwidth;
#endif
  return clamp_pframe_target_size(cpi, target, frame_update_type);
}